

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPMINRES.cpp
# Opt level: O1

double __thiscall chrono::ChSolverPMINRES::Solve(ChSolverPMINRES *this,ChSystemDescriptor *sysd)

{
  int *piVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChConstraint *pCVar7;
  ChVariables *this_00;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double *pdVar12;
  Index IVar13;
  Index IVar14;
  double *pdVar15;
  Index IVar16;
  int iVar17;
  uint uVar18;
  Index size;
  ChLog *pCVar19;
  ChStreamOutAscii *pCVar20;
  ulong uVar21;
  pointer ppCVar22;
  pointer ppCVar23;
  Index size_1;
  pointer ppCVar24;
  char *pcVar25;
  Index size_2;
  ulong uVar26;
  Index dstRows_5;
  Index dstRows_3;
  long lVar27;
  ulong uVar28;
  ChSolverPMINRES *this_01;
  SrcEvaluatorType srcEvaluator;
  Index size_3;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar38 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 in_XMM3 [16];
  ChVectorDynamic<> mr;
  ChVectorDynamic<> mz;
  ChVectorDynamic<> mp;
  ChVectorDynamic<> ml;
  ChVectorDynamic<> mtmp;
  ChVectorDynamic<> mb;
  ChVectorDynamic<> mNp;
  ChVectorDynamic<> mNMr;
  ChVectorDynamic<> mMNp;
  ChVectorDynamic<> mDi;
  ChVectorDynamic<> mNMr_old;
  ChVectorDynamic<> mz_old;
  ChVectorDynamic<> mq;
  double gi_values [3];
  scalar_max_op<double,_double,_0> local_209;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_208;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1f8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1e8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1d8;
  double local_1c0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1b8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1a8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_198;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_188;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_178;
  ChSolverPMINRES *local_160;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_158;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_148;
  double local_138;
  undefined8 uStack_130;
  Scalar local_120;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_100;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_e8;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> eStack_e0;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_d8;
  long local_d0;
  undefined8 uStack_c8;
  undefined1 local_b8 [16];
  Scalar local_a0;
  double local_98;
  undefined8 uStack_90;
  long local_88 [2];
  double local_78 [4];
  undefined8 local_58;
  undefined8 uStack_50;
  ChVectorRef local_48;
  
  if ((sysd->vstiffness).super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (sysd->vstiffness).super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dVar32 = Solve_SupportingStiffness(this,sysd);
    return dVar32;
  }
  iVar17 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  local_160 = this;
  if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
    pCVar19 = GetLog();
    pCVar20 = ChStreamOutAscii::operator<<
                        (&pCVar19->super_ChStreamOutAscii,"\n-----Projected MINRES, solving nc=");
    pCVar20 = ChStreamOutAscii::operator<<(pCVar20,iVar17);
    ChStreamOutAscii::operator<<(pCVar20,"unknowns \n");
  }
  local_1d8.m_storage.m_data = (double *)0x0;
  local_1d8.m_storage.m_rows = 0;
  lVar27 = (long)iVar17;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1d8,lVar27);
  local_1a8.m_storage.m_data = (double *)0x0;
  local_1a8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1a8,lVar27);
  local_1e8.m_storage.m_data = (double *)0x0;
  local_1e8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1e8,lVar27);
  local_208.m_storage.m_data = (double *)0x0;
  local_208.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_208,lVar27);
  local_1f8.m_storage.m_data = (double *)0x0;
  local_1f8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1f8,lVar27);
  local_118.m_storage.m_data = (double *)0x0;
  local_118.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,lVar27);
  local_198.m_storage.m_data = (double *)0x0;
  local_198.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_198,lVar27);
  local_178.m_storage.m_data = (double *)0x0;
  local_178.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_178,lVar27);
  local_188.m_storage.m_data = (double *)0x0;
  local_188.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_188,lVar27);
  local_148.m_storage.m_data = (double *)0x0;
  local_148.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_148,lVar27);
  local_1b8.m_storage.m_data = (double *)0x0;
  local_1b8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1b8,lVar27);
  auVar38 = ZEXT864(0) << 0x40;
  local_158.m_storage.m_data = (double *)0x0;
  local_158.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_158,lVar27);
  (local_160->super_ChIterativeSolverVI).m_iterations = 0;
  ppCVar23 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((sysd->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppCVar23) {
    uVar28 = 0;
  }
  else {
    uVar21 = 0;
    uVar26 = 1;
    do {
      (*ppCVar23[uVar21]->_vptr_ChConstraint[6])();
      ppCVar23 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      uVar28 = (long)(sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar23 >> 3;
      bVar8 = uVar26 < uVar28;
      uVar21 = uVar26;
      uVar26 = (ulong)((int)uVar26 + 1);
    } while (bVar8);
  }
  IVar13 = local_158.m_storage.m_rows;
  if (uVar28 != 0) {
    iVar17 = 0;
    uVar18 = 1;
    auVar38 = ZEXT1664(ZEXT816(0x4008000000000000));
    ppCVar24 = ppCVar23;
    do {
      pCVar7 = *ppCVar24;
      if (pCVar7->mode == CONSTRAINT_FRIC) {
        local_78[iVar17] = pCVar7->g_i;
        iVar17 = iVar17 + 1;
        if (iVar17 == 3) {
          dVar32 = (local_78[0] + local_78[1] + local_78[2]) / 3.0;
          ppCVar23[uVar18 - 3]->g_i = dVar32;
          ppCVar23[uVar18 - 2]->g_i = dVar32;
          pCVar7->g_i = dVar32;
          iVar17 = 0;
        }
      }
      uVar21 = (ulong)uVar18;
      ppCVar24 = ppCVar24 + 1;
      uVar18 = uVar18 + 1;
    } while (uVar21 < uVar28);
  }
  if (-1 < local_158.m_storage.m_rows) {
    if (local_158.m_storage.m_rows != 0) {
      memset(local_158.m_storage.m_data,0,local_158.m_storage.m_rows * 8);
    }
    if (uVar28 != 0) {
      uVar21 = 0;
      uVar18 = 1;
      auVar38 = ZEXT1664(ZEXT816(0x3ff0000000000000));
      iVar17 = 0;
      do {
        if (ppCVar23[uVar21]->active == true) {
          if ((iVar17 < 0) || (IVar13 <= iVar17)) goto LAB_007d5893;
          local_158.m_storage.m_data[iVar17] = 1.0 / ppCVar23[uVar21]->g_i;
          iVar17 = iVar17 + 1;
        }
        uVar21 = (ulong)uVar18;
        uVar18 = uVar18 + 1;
      } while (uVar21 < uVar28);
    }
    ppCVar22 = (sysd->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((sysd->vvariables).
        super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar22) {
      uVar18 = 1;
      uVar28 = 0;
      do {
        this_00 = ppCVar22[uVar28];
        if (this_00->disabled == false) {
          ChVariables::Get_qb(&local_48,this_00);
          ChVariables::Get_fb((ChVectorRef *)&local_100,
                              (sysd->vvariables).
                              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar28]);
          auVar38 = ZEXT864(0) << 0x40;
          local_d0 = 0;
          uStack_c8 = 0;
          local_e8 = &(local_100.m_lhs)->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
          eStack_e0.m_d.data =
               (plainobjectbase_evaluator_data<double,_0>)
               (plainobjectbase_evaluator_data<double,_0>)local_100.m_rhs;
          if ((long)local_100.m_rhs < 0 &&
              &(local_100.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> !=
              (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                          "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                         );
          }
          (*this_00->_vptr_ChVariables[4])(this_00,&local_48,&local_e8);
          if (local_d0 != 0) {
            free(*(void **)(local_d0 + -8));
          }
        }
        uVar28 = (ulong)uVar18;
        ppCVar22 = (sysd->vvariables).
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = uVar18 + 1;
      } while (uVar28 < (ulong)((long)(sysd->vvariables).
                                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar22 >>
                               3));
    }
    this_01 = local_160;
    if (-1 < local_1a8.m_storage.m_rows) {
      if (local_1a8.m_storage.m_rows != 0) {
        memset(local_1a8.m_storage.m_data,0,local_1a8.m_storage.m_rows << 3);
      }
      ppCVar23 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((sysd->vconstraints).
          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppCVar23) {
        iVar17 = 0;
        uVar28 = 0;
        uVar21 = 1;
        do {
          auVar29 = auVar38._0_16_;
          if (ppCVar23[uVar28]->active == true) {
            (*ppCVar23[uVar28]->_vptr_ChConstraint[7])();
            if ((iVar17 < 0) || (local_1a8.m_storage.m_rows <= iVar17)) {
LAB_007d5893:
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            auVar30._8_8_ = 0x8000000000000000;
            auVar30._0_8_ = 0x8000000000000000;
            auVar29 = vxorpd_avx512vl(auVar29,auVar30);
            auVar38 = ZEXT1664(auVar29);
            pdVar2 = (double *)vmovlpd_avx(auVar29);
            (&((DenseStorage<double,__1,__1,_1,_0> *)local_1a8.m_storage.m_data)->m_data)[iVar17] =
                 pdVar2;
            iVar17 = iVar17 + 1;
          }
          ppCVar23 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          bVar8 = uVar21 < (ulong)((long)(sysd->vconstraints).
                                         super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar23
                                  >> 3);
          uVar28 = uVar21;
          uVar21 = (ulong)((int)uVar21 + 1);
        } while (bVar8);
      }
      (*sysd->_vptr_ChSystemDescriptor[0xd])(sysd,&local_1b8);
      if (local_1a8.m_storage.m_rows != local_1b8.m_storage.m_rows) {
        pcVar25 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
        ;
LAB_007d594e:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar25);
      }
      uVar28 = local_1a8.m_storage.m_rows + 7;
      if (-1 < local_1a8.m_storage.m_rows) {
        uVar28 = local_1a8.m_storage.m_rows;
      }
      uVar28 = uVar28 & 0xfffffffffffffff8;
      if (7 < local_1a8.m_storage.m_rows) {
        lVar27 = 0;
        do {
          auVar38 = vsubpd_avx512f(*(undefined1 (*) [64])
                                    (&((DenseStorage<double,__1,__1,_1,_0> *)
                                      local_1a8.m_storage.m_data)->m_data + lVar27),
                                   *(undefined1 (*) [64])
                                    (&((DenseStorage<double,__1,__1,_1,_0> *)
                                      local_1b8.m_storage.m_data)->m_data + lVar27));
          *(undefined1 (*) [64])
           (&((DenseStorage<double,__1,__1,_1,_0> *)local_1a8.m_storage.m_data)->m_data + lVar27) =
               auVar38;
          lVar27 = lVar27 + 8;
        } while (lVar27 < (long)uVar28);
      }
      if ((long)uVar28 < local_1a8.m_storage.m_rows) {
        do {
          (&((DenseStorage<double,__1,__1,_1,_0> *)local_1a8.m_storage.m_data)->m_data)[uVar28] =
               (double *)
               ((double)(&((DenseStorage<double,__1,__1,_1,_0> *)local_1a8.m_storage.m_data)->m_data
                        )[uVar28] -
               (double)(&((DenseStorage<double,__1,__1,_1,_0> *)local_1b8.m_storage.m_data)->m_data)
                       [uVar28]);
          uVar28 = uVar28 + 1;
        } while (local_1a8.m_storage.m_rows != uVar28);
      }
      local_88[0] = 0;
      local_88[1] = 0;
      (*sysd->_vptr_ChSystemDescriptor[0x10])(sysd,local_88,1);
      local_1c0 = (this_01->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance;
      local_138 = this_01->rel_tolerance;
      if (local_1a8.m_storage.m_rows == 0) {
        local_120 = 0.0;
      }
      else {
        local_100.m_lhs = (LhsNested)&local_1a8;
        if (local_1a8.m_storage.m_rows < 1) {
          pcVar25 = 
          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
          ;
LAB_007d5912:
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar25);
        }
        eStack_e0.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)local_1a8.m_storage.m_data;
        local_120 = Eigen::internal::
                    redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                    ::
                    run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                              ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                *)&local_e8,&local_209,
                               (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                *)&local_100);
      }
      if ((this_01->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == true) {
        (*sysd->_vptr_ChSystemDescriptor[0x12])(sysd,&local_1d8,1);
      }
      else {
        if (local_1d8.m_storage.m_rows < 0) goto LAB_007d59d5;
        if (local_1d8.m_storage.m_rows != 0) {
          memset(local_1d8.m_storage.m_data,0,local_1d8.m_storage.m_rows << 3);
        }
      }
      (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&local_208,&local_1d8,0);
      if (local_1a8.m_storage.m_rows != local_208.m_storage.m_rows) {
LAB_007d5845:
        pcVar25 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
LAB_007d59a6:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar25);
      }
      uVar28 = local_208.m_storage.m_rows + 7;
      if (-1 < local_208.m_storage.m_rows) {
        uVar28 = local_208.m_storage.m_rows;
      }
      uVar28 = uVar28 & 0xfffffffffffffff8;
      if (7 < local_208.m_storage.m_rows) {
        lVar27 = 0;
        do {
          auVar38 = vsubpd_avx512f(*(undefined1 (*) [64])
                                    (&((DenseStorage<double,__1,__1,_1,_0> *)
                                      local_1a8.m_storage.m_data)->m_data + lVar27),
                                   *(undefined1 (*) [64])(local_208.m_storage.m_data + lVar27));
          *(undefined1 (*) [64])(local_208.m_storage.m_data + lVar27) = auVar38;
          lVar27 = lVar27 + 8;
        } while (lVar27 < (long)uVar28);
      }
      if ((long)uVar28 < local_208.m_storage.m_rows) {
        do {
          local_208.m_storage.m_data[uVar28] =
               (double)(&((DenseStorage<double,__1,__1,_1,_0> *)local_1a8.m_storage.m_data)->m_data)
                       [uVar28] - local_208.m_storage.m_data[uVar28];
          uVar28 = uVar28 + 1;
        } while (local_208.m_storage.m_rows != uVar28);
      }
      if (local_208.m_storage.m_rows < 0) {
LAB_007d5801:
        pcVar25 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_007d5816;
      }
      if (local_1d8.m_storage.m_rows != local_208.m_storage.m_rows) {
LAB_007d585f:
        pcVar25 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_007d59a6;
      }
      dVar32 = this_01->grad_diffstep;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar32;
      uVar28 = local_208.m_storage.m_rows + 7;
      if (-1 < local_208.m_storage.m_rows) {
        uVar28 = local_208.m_storage.m_rows;
      }
      uVar28 = uVar28 & 0xfffffffffffffff8;
      if (7 < local_208.m_storage.m_rows) {
        auVar38 = vbroadcastsd_avx512f(auVar29);
        lVar27 = 0;
        do {
          auVar31 = vmulpd_avx512f(auVar38,*(undefined1 (*) [64])
                                            (local_208.m_storage.m_data + lVar27));
          auVar31 = vaddpd_avx512f(auVar31,*(undefined1 (*) [64])
                                            (local_1d8.m_storage.m_data + lVar27));
          *(undefined1 (*) [64])(local_208.m_storage.m_data + lVar27) = auVar31;
          lVar27 = lVar27 + 8;
        } while (lVar27 < (long)uVar28);
      }
      if ((long)uVar28 < local_208.m_storage.m_rows) {
        do {
          local_208.m_storage.m_data[uVar28] =
               dVar32 * local_208.m_storage.m_data[uVar28] + local_1d8.m_storage.m_data[uVar28];
          uVar28 = uVar28 + 1;
        } while (local_208.m_storage.m_rows != uVar28);
      }
      (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd);
      IVar14 = local_158.m_storage.m_rows;
      pdVar12 = local_158.m_storage.m_data;
      IVar13 = local_208.m_storage.m_rows;
      pdVar2 = local_208.m_storage.m_data;
      if (local_208.m_storage.m_rows != local_1d8.m_storage.m_rows) goto LAB_007d5845;
      if (local_1d8.m_storage.m_rows < 0) goto LAB_007d5801;
      if (local_208.m_storage.m_rows != local_1d8.m_storage.m_rows) {
LAB_007d591f:
        pcVar25 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
        ;
        goto LAB_007d59c8;
      }
      dVar32 = this_01->grad_diffstep;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar32;
      uVar28 = local_208.m_storage.m_rows + 7;
      if (-1 < local_208.m_storage.m_rows) {
        uVar28 = local_208.m_storage.m_rows;
      }
      uVar28 = uVar28 & 0xfffffffffffffff8;
      if (7 < local_208.m_storage.m_rows) {
        auVar38 = vbroadcastsd_avx512f(auVar33);
        lVar27 = 0;
        do {
          auVar31 = vsubpd_avx512f(*(undefined1 (*) [64])(local_208.m_storage.m_data + lVar27),
                                   *(undefined1 (*) [64])(local_1d8.m_storage.m_data + lVar27));
          auVar31 = vdivpd_avx512f(auVar31,auVar38);
          *(undefined1 (*) [64])(local_208.m_storage.m_data + lVar27) = auVar31;
          lVar27 = lVar27 + 8;
        } while (lVar27 < (long)uVar28);
      }
      if ((long)uVar28 < local_208.m_storage.m_rows) {
        do {
          local_208.m_storage.m_data[uVar28] =
               (local_208.m_storage.m_data[uVar28] - local_1d8.m_storage.m_data[uVar28]) / dVar32;
          uVar28 = uVar28 + 1;
        } while (local_208.m_storage.m_rows != uVar28);
      }
      if ((this_01->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
        if (local_208.m_storage.m_rows != local_158.m_storage.m_rows) {
LAB_007d5991:
          pcVar25 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_007d59a6;
        }
        if (local_1e8.m_storage.m_rows != local_158.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_1e8,local_158.m_storage.m_rows,1);
        }
        if (local_1e8.m_storage.m_rows != IVar14) {
LAB_007d59b3:
          pcVar25 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
          ;
          goto LAB_007d59c8;
        }
        uVar28 = local_1e8.m_storage.m_rows + 7;
        if (-1 < local_1e8.m_storage.m_rows) {
          uVar28 = local_1e8.m_storage.m_rows;
        }
        uVar28 = uVar28 & 0xfffffffffffffff8;
        if (7 < local_1e8.m_storage.m_rows) {
          lVar27 = 0;
          do {
            auVar38 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar2 + lVar27),
                                     *(undefined1 (*) [64])(pdVar12 + lVar27));
            *(undefined1 (*) [64])(local_1e8.m_storage.m_data + lVar27) = auVar38;
            lVar27 = lVar27 + 8;
          } while (lVar27 < (long)uVar28);
        }
        this_01 = local_160;
        if ((long)uVar28 < local_1e8.m_storage.m_rows) {
          do {
            local_1e8.m_storage.m_data[uVar28] = pdVar2[uVar28] * pdVar12[uVar28];
            uVar28 = uVar28 + 1;
          } while (local_1e8.m_storage.m_rows != uVar28);
        }
LAB_007d4783:
        IVar13 = local_1e8.m_storage.m_rows;
        pdVar2 = local_1e8.m_storage.m_data;
        if (local_1f8.m_storage.m_rows != local_1e8.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_1f8,local_1e8.m_storage.m_rows,1);
        }
        if (local_1f8.m_storage.m_rows == IVar13) {
          uVar28 = local_1f8.m_storage.m_rows + 7;
          if (-1 < local_1f8.m_storage.m_rows) {
            uVar28 = local_1f8.m_storage.m_rows;
          }
          uVar28 = uVar28 & 0xfffffffffffffff8;
          if (7 < local_1f8.m_storage.m_rows) {
            lVar27 = 0;
            do {
              *(undefined1 (*) [64])
               (&((DenseStorage<double,__1,__1,_1,_0> *)local_1f8.m_storage.m_data)->m_data + lVar27
               ) = *(undefined1 (*) [64])(pdVar2 + lVar27);
              lVar27 = lVar27 + 8;
            } while (lVar27 < (long)uVar28);
          }
          if ((long)uVar28 < local_1f8.m_storage.m_rows) {
            do {
              (&((DenseStorage<double,__1,__1,_1,_0> *)local_1f8.m_storage.m_data)->m_data)[uVar28]
                   = (double *)pdVar2[uVar28];
              uVar28 = uVar28 + 1;
            } while (local_1f8.m_storage.m_rows != uVar28);
          }
          (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&local_188,&local_1f8);
          (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&local_198,&local_1e8);
          if (0 < (this_01->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_1c0;
            auVar34._8_8_ = 0;
            auVar34._0_8_ = local_120 * local_138;
            auVar29 = vmaxsd_avx(auVar34,auVar3);
            local_120 = auVar29._0_8_;
            uVar18 = 0;
            local_58 = 0x7fffffffffffffff;
            uStack_50 = 0x7fffffffffffffff;
            do {
              IVar14 = local_158.m_storage.m_rows;
              pdVar12 = local_158.m_storage.m_data;
              IVar13 = local_198.m_storage.m_rows;
              pdVar2 = local_198.m_storage.m_data;
              if ((this_01->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true
                 ) {
                if (local_198.m_storage.m_rows != local_158.m_storage.m_rows) goto LAB_007d5991;
                if (local_178.m_storage.m_rows != local_158.m_storage.m_rows) {
                  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                            (&local_178,local_158.m_storage.m_rows,1);
                }
                if (local_178.m_storage.m_rows != IVar14) goto LAB_007d59b3;
                uVar28 = local_178.m_storage.m_rows + 7;
                if (-1 < local_178.m_storage.m_rows) {
                  uVar28 = local_178.m_storage.m_rows;
                }
                uVar28 = uVar28 & 0xfffffffffffffff8;
                if (7 < local_178.m_storage.m_rows) {
                  lVar27 = 0;
                  do {
                    auVar38 = vmulpd_avx512f(*(undefined1 (*) [64])
                                              (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->
                                                m_data + lVar27),
                                             *(undefined1 (*) [64])(pdVar12 + lVar27));
                    *(undefined1 (*) [64])
                     (&((DenseStorage<double,__1,__1,_1,_0> *)local_178.m_storage.m_data)->m_data +
                     lVar27) = auVar38;
                    lVar27 = lVar27 + 8;
                  } while (lVar27 < (long)uVar28);
                }
                if ((long)uVar28 < local_178.m_storage.m_rows) {
                  do {
                    (&((DenseStorage<double,__1,__1,_1,_0> *)local_178.m_storage.m_data)->m_data)
                    [uVar28] = (double *)
                               ((double)(&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data)
                                        [uVar28] * pdVar12[uVar28]);
                    uVar28 = uVar28 + 1;
                  } while (local_178.m_storage.m_rows != uVar28);
                }
              }
              else {
                if (local_178.m_storage.m_rows != local_198.m_storage.m_rows) {
                  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                            (&local_178,local_198.m_storage.m_rows,1);
                }
                if (local_178.m_storage.m_rows != IVar13) goto LAB_007d58b2;
                uVar28 = local_178.m_storage.m_rows + 7;
                if (-1 < local_178.m_storage.m_rows) {
                  uVar28 = local_178.m_storage.m_rows;
                }
                uVar28 = uVar28 & 0xfffffffffffffff8;
                if (7 < local_178.m_storage.m_rows) {
                  lVar27 = 0;
                  do {
                    *(undefined1 (*) [64])
                     (&((DenseStorage<double,__1,__1,_1,_0> *)local_178.m_storage.m_data)->m_data +
                     lVar27) = *(undefined1 (*) [64])
                                (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data + lVar27);
                    lVar27 = lVar27 + 8;
                  } while (lVar27 < (long)uVar28);
                }
                if ((long)uVar28 < local_178.m_storage.m_rows) {
                  do {
                    (&((DenseStorage<double,__1,__1,_1,_0> *)local_178.m_storage.m_data)->m_data)
                    [uVar28] = (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data)[uVar28];
                    uVar28 = uVar28 + 1;
                  } while (local_178.m_storage.m_rows != uVar28);
                }
              }
              if (local_1f8.m_storage.m_rows != local_188.m_storage.m_rows) goto LAB_007d5823;
              local_100.m_lhs = (LhsNested)&local_1f8;
              local_100.m_rhs = (RhsNested)&local_188;
              if (local_188.m_storage.m_rows != 0) {
                if (0 < local_188.m_storage.m_rows) {
                  eStack_e0.m_d.data =
                       (plainobjectbase_evaluator_data<double,_0>)
                       (plainobjectbase_evaluator_data<double,_0>)local_1f8.m_storage.m_data;
                  local_d8.m_d.data =
                       (plainobjectbase_evaluator_data<double,_0>)
                       (plainobjectbase_evaluator_data<double,_0>)local_188.m_storage.m_data;
                  local_1c0 = Eigen::internal::
                              redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                              ::
                              run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                        ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                          *)&local_e8,(scalar_sum_op<double,_double> *)&local_209,
                                         &local_100);
                  goto LAB_007d4a6d;
                }
LAB_007d58cc:
                pcVar25 = 
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                ;
                goto LAB_007d5912;
              }
              local_1c0 = 0.0;
LAB_007d4a6d:
              this_01 = local_160;
              if (local_178.m_storage.m_rows != local_198.m_storage.m_rows) goto LAB_007d5823;
              local_100.m_lhs = (LhsNested)&local_178;
              local_100.m_rhs = (RhsNested)&local_198;
              if (local_198.m_storage.m_rows == 0) {
                auVar29 = ZEXT816(0) << 0x40;
              }
              else {
                if (local_198.m_storage.m_rows < 1) goto LAB_007d58cc;
                eStack_e0.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)local_178.m_storage.m_data;
                local_d8.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)local_198.m_storage.m_data;
                auVar38._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&local_e8,(scalar_sum_op<double,_double> *)&local_209,&local_100)
                ;
                auVar38._8_56_ = extraout_var;
                auVar29 = auVar38._0_16_;
              }
              auVar9._8_8_ = 0x7fffffffffffffff;
              auVar9._0_8_ = 0x7fffffffffffffff;
              auVar30 = vandpd_avx512vl(auVar29,auVar9);
              if (1e-29 <= auVar30._0_8_) {
                local_138 = auVar29._0_8_;
              }
              else {
                local_138 = 1e-11;
                local_b8 = auVar29;
                if ((this_01->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose ==
                    true) {
                  pCVar19 = GetLog();
                  pCVar20 = ChStreamOutAscii::operator<<(&pCVar19->super_ChStreamOutAscii,"Iter=");
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,uVar18);
                  pCVar20 = ChStreamOutAscii::operator<<
                                      (pCVar20," Rayleigh quotient alpha breakdown: ");
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,local_1c0);
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20," / ");
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,(double)local_b8._0_8_);
                  ChStreamOutAscii::operator<<(pCVar20,"\n");
                  local_138 = 1e-11;
                }
              }
              IVar13 = local_1e8.m_storage.m_rows;
              pdVar2 = local_1e8.m_storage.m_data;
              if (local_1e8.m_storage.m_rows < 0) goto LAB_007d5801;
              if (local_1b8.m_storage.m_rows != local_1e8.m_storage.m_rows) {
                Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                          (&local_1b8,local_1e8.m_storage.m_rows,1);
              }
              if (local_1b8.m_storage.m_rows != IVar13) {
                pcVar25 = 
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
                ;
                goto LAB_007d59c8;
              }
              auVar35._0_8_ = local_1c0 / local_138;
              auVar35._8_8_ = 0;
              uVar28 = local_1b8.m_storage.m_rows + 7;
              if (-1 < local_1b8.m_storage.m_rows) {
                uVar28 = local_1b8.m_storage.m_rows;
              }
              uVar28 = uVar28 & 0xfffffffffffffff8;
              if (7 < local_1b8.m_storage.m_rows) {
                auVar38 = vbroadcastsd_avx512f(auVar35);
                lVar27 = 0;
                do {
                  auVar31 = vmulpd_avx512f(auVar38,*(undefined1 (*) [64])(pdVar2 + lVar27));
                  *(undefined1 (*) [64])(local_1b8.m_storage.m_data + lVar27) = auVar31;
                  lVar27 = lVar27 + 8;
                } while (lVar27 < (long)uVar28);
              }
              if ((long)uVar28 < local_1b8.m_storage.m_rows) {
                do {
                  local_1b8.m_storage.m_data[uVar28] = auVar35._0_8_ * pdVar2[uVar28];
                  uVar28 = uVar28 + 1;
                } while (local_1b8.m_storage.m_rows != uVar28);
              }
              if (local_1d8.m_storage.m_rows != local_1b8.m_storage.m_rows) {
                pcVar25 = 
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                ;
                goto LAB_007d594e;
              }
              uVar28 = local_1d8.m_storage.m_rows + 7;
              if (-1 < local_1d8.m_storage.m_rows) {
                uVar28 = local_1d8.m_storage.m_rows;
              }
              uVar28 = uVar28 & 0xfffffffffffffff8;
              if (7 < local_1d8.m_storage.m_rows) {
                lVar27 = 0;
                do {
                  auVar38 = vaddpd_avx512f(*(undefined1 (*) [64])
                                            (local_1b8.m_storage.m_data + lVar27),
                                           *(undefined1 (*) [64])
                                            (local_1d8.m_storage.m_data + lVar27));
                  *(undefined1 (*) [64])(local_1d8.m_storage.m_data + lVar27) = auVar38;
                  lVar27 = lVar27 + 8;
                } while (lVar27 < (long)uVar28);
              }
              if ((long)uVar28 < local_1d8.m_storage.m_rows) {
                do {
                  local_1d8.m_storage.m_data[uVar28] =
                       local_1b8.m_storage.m_data[uVar28] + local_1d8.m_storage.m_data[uVar28];
                  uVar28 = uVar28 + 1;
                } while (local_1d8.m_storage.m_rows != uVar28);
              }
              local_100.m_lhs = (LhsNested)&local_1b8;
              if (local_1b8.m_storage.m_rows != 0) {
                if (0 < local_1b8.m_storage.m_rows) {
                  eStack_e0.m_d.data =
                       (plainobjectbase_evaluator_data<double,_0>)
                       (plainobjectbase_evaluator_data<double,_0>)local_1b8.m_storage.m_data;
                  local_a0 = Eigen::internal::
                             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                             ::
                             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         *)&local_e8,(scalar_sum_op<double,_double> *)&local_209,
                                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         *)&local_100);
                  goto LAB_007d4d0d;
                }
LAB_007d58fd:
                pcVar25 = 
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                ;
                goto LAB_007d5912;
              }
              local_a0 = 0.0;
LAB_007d4d0d:
              (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,&local_1d8);
              (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&local_208,&local_1d8,0);
              if (local_1a8.m_storage.m_rows != local_208.m_storage.m_rows) goto LAB_007d5845;
              uVar28 = local_208.m_storage.m_rows + 7;
              if (-1 < local_208.m_storage.m_rows) {
                uVar28 = local_208.m_storage.m_rows;
              }
              uVar28 = uVar28 & 0xfffffffffffffff8;
              if (7 < local_208.m_storage.m_rows) {
                lVar27 = 0;
                do {
                  auVar38 = vsubpd_avx512f(*(undefined1 (*) [64])
                                            (&((DenseStorage<double,__1,__1,_1,_0> *)
                                              local_1a8.m_storage.m_data)->m_data + lVar27),
                                           *(undefined1 (*) [64])
                                            (local_208.m_storage.m_data + lVar27));
                  *(undefined1 (*) [64])(local_208.m_storage.m_data + lVar27) = auVar38;
                  lVar27 = lVar27 + 8;
                } while (lVar27 < (long)uVar28);
              }
              if ((long)uVar28 < local_208.m_storage.m_rows) {
                do {
                  local_208.m_storage.m_data[uVar28] =
                       (double)(&((DenseStorage<double,__1,__1,_1,_0> *)local_1a8.m_storage.m_data)
                                 ->m_data)[uVar28] - local_208.m_storage.m_data[uVar28];
                  uVar28 = uVar28 + 1;
                } while (local_208.m_storage.m_rows != uVar28);
              }
              if (local_208.m_storage.m_rows < 0) goto LAB_007d5801;
              if (local_1d8.m_storage.m_rows != local_208.m_storage.m_rows) goto LAB_007d585f;
              dVar32 = this_01->grad_diffstep;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = dVar32;
              uVar28 = local_208.m_storage.m_rows + 7;
              if (-1 < local_208.m_storage.m_rows) {
                uVar28 = local_208.m_storage.m_rows;
              }
              uVar28 = uVar28 & 0xfffffffffffffff8;
              if (7 < local_208.m_storage.m_rows) {
                auVar38 = vbroadcastsd_avx512f(auVar36);
                lVar27 = 0;
                do {
                  auVar31 = vmulpd_avx512f(auVar38,*(undefined1 (*) [64])
                                                    (local_208.m_storage.m_data + lVar27));
                  auVar31 = vaddpd_avx512f(auVar31,*(undefined1 (*) [64])
                                                    (local_1d8.m_storage.m_data + lVar27));
                  *(undefined1 (*) [64])(local_208.m_storage.m_data + lVar27) = auVar31;
                  lVar27 = lVar27 + 8;
                } while (lVar27 < (long)uVar28);
              }
              if ((long)uVar28 < local_208.m_storage.m_rows) {
                do {
                  local_208.m_storage.m_data[uVar28] =
                       dVar32 * local_208.m_storage.m_data[uVar28] +
                       local_1d8.m_storage.m_data[uVar28];
                  uVar28 = uVar28 + 1;
                } while (local_208.m_storage.m_rows != uVar28);
              }
              (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,&local_208);
              if (local_208.m_storage.m_rows != local_1d8.m_storage.m_rows) goto LAB_007d5845;
              if (local_1d8.m_storage.m_rows < 0) goto LAB_007d5801;
              if (local_208.m_storage.m_rows != local_1d8.m_storage.m_rows) goto LAB_007d591f;
              dVar32 = this_01->grad_diffstep;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = dVar32;
              uVar28 = local_208.m_storage.m_rows + 7;
              if (-1 < local_208.m_storage.m_rows) {
                uVar28 = local_208.m_storage.m_rows;
              }
              uVar28 = uVar28 & 0xfffffffffffffff8;
              if (7 < local_208.m_storage.m_rows) {
                auVar38 = vbroadcastsd_avx512f(auVar37);
                lVar27 = 0;
                do {
                  auVar31 = vsubpd_avx512f(*(undefined1 (*) [64])
                                            (local_208.m_storage.m_data + lVar27),
                                           *(undefined1 (*) [64])
                                            (local_1d8.m_storage.m_data + lVar27));
                  auVar31 = vdivpd_avx512f(auVar31,auVar38);
                  *(undefined1 (*) [64])(local_208.m_storage.m_data + lVar27) = auVar31;
                  lVar27 = lVar27 + 8;
                } while (lVar27 < (long)uVar28);
              }
              if ((long)uVar28 < local_208.m_storage.m_rows) {
                do {
                  local_208.m_storage.m_data[uVar28] =
                       (local_208.m_storage.m_data[uVar28] - local_1d8.m_storage.m_data[uVar28]) /
                       dVar32;
                  uVar28 = uVar28 + 1;
                } while (local_208.m_storage.m_rows != uVar28);
              }
              piVar1 = &(this_01->super_ChIterativeSolverVI).m_iterations;
              *piVar1 = *piVar1 + 1;
              local_100.m_lhs = (LhsNested)&local_208;
              if (local_208.m_storage.m_rows == 0) {
                auVar29 = SUB6416(ZEXT864(0),0);
              }
              else {
                if (local_208.m_storage.m_rows < 1) goto LAB_007d58fd;
                eStack_e0.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)local_208.m_storage.m_data;
                auVar31._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&local_e8,(scalar_sum_op<double,_double> *)&local_209,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                 *)&local_100);
                auVar31._8_56_ = extraout_var_00;
                auVar29 = auVar31._0_16_;
              }
              IVar13 = local_1f8.m_storage.m_rows;
              pdVar2 = local_1f8.m_storage.m_data;
              auVar29 = vsqrtsd_avx(auVar29,auVar29);
              local_1c0 = auVar29._0_8_;
              this_01->r_proj_resid = local_1c0;
              if (local_1c0 < local_120) {
                if ((this_01->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose ==
                    true) {
                  pCVar19 = GetLog();
                  pCVar20 = ChStreamOutAscii::operator<<(&pCVar19->super_ChStreamOutAscii,"Iter=");
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,uVar18);
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20," P(r)-converged!  |P(r)|=");
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,this_01->r_proj_resid);
                  ChStreamOutAscii::operator<<(pCVar20,"\n");
                }
              }
              else {
                if (local_118.m_storage.m_rows != local_1f8.m_storage.m_rows) {
                  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                            (&local_118,local_1f8.m_storage.m_rows,1);
                }
                IVar16 = local_158.m_storage.m_rows;
                pdVar15 = local_158.m_storage.m_data;
                IVar14 = local_208.m_storage.m_rows;
                pdVar12 = local_208.m_storage.m_data;
                if (local_118.m_storage.m_rows != IVar13) goto LAB_007d58b2;
                uVar28 = local_118.m_storage.m_rows + 7;
                if (-1 < local_118.m_storage.m_rows) {
                  uVar28 = local_118.m_storage.m_rows;
                }
                uVar28 = uVar28 & 0xfffffffffffffff8;
                if (7 < local_118.m_storage.m_rows) {
                  lVar27 = 0;
                  do {
                    *(undefined1 (*) [64])
                     (&((DenseStorage<double,__1,__1,_1,_0> *)local_118.m_storage.m_data)->m_data +
                     lVar27) = *(undefined1 (*) [64])
                                (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data + lVar27);
                    lVar27 = lVar27 + 8;
                  } while (lVar27 < (long)uVar28);
                }
                if ((long)uVar28 < local_118.m_storage.m_rows) {
                  do {
                    (&((DenseStorage<double,__1,__1,_1,_0> *)local_118.m_storage.m_data)->m_data)
                    [uVar28] = (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data)[uVar28];
                    uVar28 = uVar28 + 1;
                  } while (local_118.m_storage.m_rows != uVar28);
                }
                if ((this_01->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond ==
                    true) {
                  if (local_208.m_storage.m_rows != local_158.m_storage.m_rows) goto LAB_007d5991;
                  if (local_1f8.m_storage.m_rows != local_158.m_storage.m_rows) {
                    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                              (&local_1f8,local_158.m_storage.m_rows,1);
                  }
                  if (local_1f8.m_storage.m_rows != IVar16) goto LAB_007d59b3;
                  uVar28 = local_1f8.m_storage.m_rows + 7;
                  if (-1 < local_1f8.m_storage.m_rows) {
                    uVar28 = local_1f8.m_storage.m_rows;
                  }
                  uVar28 = uVar28 & 0xfffffffffffffff8;
                  if (7 < local_1f8.m_storage.m_rows) {
                    lVar27 = 0;
                    do {
                      auVar38 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar12)->
                                                  m_data + lVar27),
                                               *(undefined1 (*) [64])(pdVar15 + lVar27));
                      *(undefined1 (*) [64])
                       (&((DenseStorage<double,__1,__1,_1,_0> *)local_1f8.m_storage.m_data)->m_data
                       + lVar27) = auVar38;
                      lVar27 = lVar27 + 8;
                    } while (lVar27 < (long)uVar28);
                  }
                  if ((long)uVar28 < local_1f8.m_storage.m_rows) {
                    do {
                      (&((DenseStorage<double,__1,__1,_1,_0> *)local_1f8.m_storage.m_data)->m_data)
                      [uVar28] = (double *)
                                 ((double)(&((DenseStorage<double,__1,__1,_1,_0> *)pdVar12)->m_data)
                                          [uVar28] * pdVar15[uVar28]);
                      uVar28 = uVar28 + 1;
                    } while (local_1f8.m_storage.m_rows != uVar28);
                  }
                }
                else {
                  if (local_1f8.m_storage.m_rows != local_208.m_storage.m_rows) {
                    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                              (&local_1f8,local_208.m_storage.m_rows,1);
                  }
                  if (local_1f8.m_storage.m_rows != IVar14) goto LAB_007d58b2;
                  uVar28 = local_1f8.m_storage.m_rows + 7;
                  if (-1 < local_1f8.m_storage.m_rows) {
                    uVar28 = local_1f8.m_storage.m_rows;
                  }
                  uVar28 = uVar28 & 0xfffffffffffffff8;
                  if (7 < local_1f8.m_storage.m_rows) {
                    lVar27 = 0;
                    do {
                      *(undefined1 (*) [64])
                       (&((DenseStorage<double,__1,__1,_1,_0> *)local_1f8.m_storage.m_data)->m_data
                       + lVar27) = *(undefined1 (*) [64])
                                    (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar12)->m_data +
                                    lVar27);
                      lVar27 = lVar27 + 8;
                    } while (lVar27 < (long)uVar28);
                  }
                  if ((long)uVar28 < local_1f8.m_storage.m_rows) {
                    do {
                      (&((DenseStorage<double,__1,__1,_1,_0> *)local_1f8.m_storage.m_data)->m_data)
                      [uVar28] = (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar12)->m_data)[uVar28];
                      uVar28 = uVar28 + 1;
                    } while (local_1f8.m_storage.m_rows != uVar28);
                  }
                }
                IVar13 = local_188.m_storage.m_rows;
                pdVar2 = local_188.m_storage.m_data;
                if (local_148.m_storage.m_rows != local_188.m_storage.m_rows) {
                  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                            (&local_148,local_188.m_storage.m_rows,1);
                }
                if (local_148.m_storage.m_rows != IVar13) goto LAB_007d58b2;
                uVar28 = local_148.m_storage.m_rows + 7;
                if (-1 < local_148.m_storage.m_rows) {
                  uVar28 = local_148.m_storage.m_rows;
                }
                uVar28 = uVar28 & 0xfffffffffffffff8;
                if (7 < local_148.m_storage.m_rows) {
                  lVar27 = 0;
                  do {
                    *(undefined1 (*) [64])
                     (&((DenseStorage<double,__1,__1,_1,_0> *)local_148.m_storage.m_data)->m_data +
                     lVar27) = *(undefined1 (*) [64])
                                (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data + lVar27);
                    lVar27 = lVar27 + 8;
                  } while (lVar27 < (long)uVar28);
                }
                if ((long)uVar28 < local_148.m_storage.m_rows) {
                  do {
                    (&((DenseStorage<double,__1,__1,_1,_0> *)local_148.m_storage.m_data)->m_data)
                    [uVar28] = (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data)[uVar28];
                    uVar28 = uVar28 + 1;
                  } while (local_148.m_storage.m_rows != uVar28);
                }
                (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&local_188,&local_1f8,0);
                IVar13 = local_148.m_storage.m_rows;
                pdVar12 = local_148.m_storage.m_data;
                pdVar2 = local_188.m_storage.m_data;
                if (local_188.m_storage.m_rows != local_148.m_storage.m_rows) goto LAB_007d5845;
                if (local_1b8.m_storage.m_rows != local_148.m_storage.m_rows) {
                  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                            (&local_1b8,local_148.m_storage.m_rows,1);
                }
                this_01 = local_160;
                if (local_1b8.m_storage.m_rows != IVar13) {
                  pcVar25 = 
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
                  ;
                  goto LAB_007d59c8;
                }
                uVar28 = local_1b8.m_storage.m_rows + 7;
                if (-1 < local_1b8.m_storage.m_rows) {
                  uVar28 = local_1b8.m_storage.m_rows;
                }
                uVar28 = uVar28 & 0xfffffffffffffff8;
                if (7 < local_1b8.m_storage.m_rows) {
                  lVar27 = 0;
                  do {
                    auVar38 = vsubpd_avx512f(*(undefined1 (*) [64])
                                              (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->
                                                m_data + lVar27),
                                             *(undefined1 (*) [64])
                                              (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar12)->
                                                m_data + lVar27));
                    *(undefined1 (*) [64])(local_1b8.m_storage.m_data + lVar27) = auVar38;
                    lVar27 = lVar27 + 8;
                  } while (lVar27 < (long)uVar28);
                }
                if ((long)uVar28 < local_1b8.m_storage.m_rows) {
                  do {
                    local_1b8.m_storage.m_data[uVar28] =
                         (double)(&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data)[uVar28] -
                         (double)(&((DenseStorage<double,__1,__1,_1,_0> *)pdVar12)->m_data)[uVar28];
                    uVar28 = uVar28 + 1;
                  } while (local_1b8.m_storage.m_rows != uVar28);
                }
                if (local_1f8.m_storage.m_rows != local_1b8.m_storage.m_rows) goto LAB_007d5823;
                local_100.m_lhs = (LhsNested)&local_1f8;
                local_100.m_rhs = (RhsNested)&local_1b8;
                if (local_1b8.m_storage.m_rows == 0) {
                  local_b8 = ZEXT816(0);
                }
                else {
                  if (local_1b8.m_storage.m_rows < 1) goto LAB_007d58cc;
                  eStack_e0.m_d.data =
                       (plainobjectbase_evaluator_data<double,_0>)
                       (plainobjectbase_evaluator_data<double,_0>)local_1f8.m_storage.m_data;
                  local_d8.m_d.data =
                       (plainobjectbase_evaluator_data<double,_0>)
                       (plainobjectbase_evaluator_data<double,_0>)local_1b8.m_storage.m_data;
                  local_b8._0_8_ =
                       Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                       ::
                       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                 ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)&local_e8,(scalar_sum_op<double,_double> *)&local_209,
                                  &local_100);
                  local_b8._8_8_ = extraout_XMM0_Qb;
                }
                if (local_118.m_storage.m_rows != local_148.m_storage.m_rows) {
LAB_007d5823:
                  __assert_fail("size() == other.size()","/usr/include/eigen3/Eigen/src/Core/Dot.h",
                                0x52,
                                "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                               );
                }
                local_100.m_lhs = (LhsNested)&local_118;
                local_100.m_rhs = (RhsNested)&local_148;
                if (local_148.m_storage.m_rows == 0) {
                  local_98 = 0.0;
                  uStack_90 = 0;
                }
                else {
                  if (local_148.m_storage.m_rows < 1) goto LAB_007d58cc;
                  eStack_e0.m_d.data =
                       (plainobjectbase_evaluator_data<double,_0>)
                       (plainobjectbase_evaluator_data<double,_0>)local_118.m_storage.m_data;
                  local_d8.m_d.data =
                       (plainobjectbase_evaluator_data<double,_0>)
                       (plainobjectbase_evaluator_data<double,_0>)local_148.m_storage.m_data;
                  local_98 = Eigen::internal::
                             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                             ::
                             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                       ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         *)&local_e8,(scalar_sum_op<double,_double> *)&local_209,
                                        &local_100);
                  uStack_90 = extraout_XMM0_Qb_00;
                }
                auVar11._8_8_ = uStack_50;
                auVar11._0_8_ = local_58;
                auVar29 = vandpd_avx(auVar11,local_b8);
                if ((auVar29._0_8_ < 1e-29) ||
                   (auVar10._8_8_ = uStack_90, auVar10._0_8_ = local_98,
                   auVar29 = vandpd_avx(auVar11,auVar10), auVar29._0_8_ < 1e-29)) {
                  local_138 = 0.0;
                  uStack_130 = 0;
                  if ((this_01->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose
                      == true) {
                    pCVar19 = GetLog();
                    pCVar20 = ChStreamOutAscii::operator<<(&pCVar19->super_ChStreamOutAscii,"Iter=")
                    ;
                    pCVar20 = ChStreamOutAscii::operator<<(pCVar20,uVar18);
                    pCVar20 = ChStreamOutAscii::operator<<
                                        (pCVar20," Ribiere quotient beta restart: ");
                    pCVar20 = ChStreamOutAscii::operator<<(pCVar20,(double)local_b8._0_8_);
                    pCVar20 = ChStreamOutAscii::operator<<(pCVar20," / ");
                    pCVar20 = ChStreamOutAscii::operator<<(pCVar20,local_98);
                    ChStreamOutAscii::operator<<(pCVar20,"\n");
                  }
                }
                else {
                  local_138 = (double)local_b8._0_8_ / local_98;
                  uStack_130 = local_b8._8_8_;
                }
                if (local_1e8.m_storage.m_rows < 0) goto LAB_007d5801;
                if (local_1f8.m_storage.m_rows != local_1e8.m_storage.m_rows) goto LAB_007d585f;
                uVar28 = local_1e8.m_storage.m_rows + 7;
                if (-1 < local_1e8.m_storage.m_rows) {
                  uVar28 = local_1e8.m_storage.m_rows;
                }
                uVar28 = uVar28 & 0xfffffffffffffff8;
                if (7 < local_1e8.m_storage.m_rows) {
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = local_138;
                  auVar38 = vbroadcastsd_avx512f(auVar4);
                  lVar27 = 0;
                  do {
                    auVar31 = vmulpd_avx512f(auVar38,*(undefined1 (*) [64])
                                                      (local_1e8.m_storage.m_data + lVar27));
                    auVar31 = vaddpd_avx512f(auVar31,*(undefined1 (*) [64])
                                                      (&((DenseStorage<double,__1,__1,_1,_0> *)
                                                        local_1f8.m_storage.m_data)->m_data + lVar27
                                                      ));
                    *(undefined1 (*) [64])(local_1e8.m_storage.m_data + lVar27) = auVar31;
                    lVar27 = lVar27 + 8;
                  } while (lVar27 < (long)uVar28);
                }
                if ((long)uVar28 < local_1e8.m_storage.m_rows) {
                  do {
                    local_1e8.m_storage.m_data[uVar28] =
                         local_138 * local_1e8.m_storage.m_data[uVar28] +
                         (double)(&((DenseStorage<double,__1,__1,_1,_0> *)local_1f8.m_storage.m_data
                                   )->m_data)[uVar28];
                    uVar28 = uVar28 + 1;
                  } while (local_1e8.m_storage.m_rows != uVar28);
                }
                if (local_198.m_storage.m_rows < 0) goto LAB_007d5801;
                if (local_188.m_storage.m_rows != local_198.m_storage.m_rows) goto LAB_007d585f;
                uVar28 = local_198.m_storage.m_rows + 7;
                if (-1 < local_198.m_storage.m_rows) {
                  uVar28 = local_198.m_storage.m_rows;
                }
                uVar28 = uVar28 & 0xfffffffffffffff8;
                if (7 < local_198.m_storage.m_rows) {
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = local_138;
                  auVar38 = vbroadcastsd_avx512f(auVar5);
                  lVar27 = 0;
                  do {
                    auVar31 = vmulpd_avx512f(auVar38,*(undefined1 (*) [64])
                                                      (&((DenseStorage<double,__1,__1,_1,_0> *)
                                                        local_198.m_storage.m_data)->m_data + lVar27
                                                      ));
                    auVar31 = vaddpd_avx512f(auVar31,*(undefined1 (*) [64])
                                                      (&((DenseStorage<double,__1,__1,_1,_0> *)
                                                        local_188.m_storage.m_data)->m_data + lVar27
                                                      ));
                    *(undefined1 (*) [64])
                     (&((DenseStorage<double,__1,__1,_1,_0> *)local_198.m_storage.m_data)->m_data +
                     lVar27) = auVar31;
                    lVar27 = lVar27 + 8;
                  } while (lVar27 < (long)uVar28);
                }
                if ((long)uVar28 < local_198.m_storage.m_rows) {
                  do {
                    (&((DenseStorage<double,__1,__1,_1,_0> *)local_198.m_storage.m_data)->m_data)
                    [uVar28] = (double *)
                               (local_138 *
                                (double)(&((DenseStorage<double,__1,__1,_1,_0> *)
                                          local_198.m_storage.m_data)->m_data)[uVar28] +
                               (double)(&((DenseStorage<double,__1,__1,_1,_0> *)
                                         local_188.m_storage.m_data)->m_data)[uVar28]);
                    uVar28 = uVar28 + 1;
                  } while (local_198.m_storage.m_rows != uVar28);
                }
                if ((this_01->super_ChIterativeSolverVI).record_violation_history == true) {
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = local_a0;
                  auVar29 = vsqrtsd_avx(in_XMM3,auVar6);
                  ChIterativeSolverVI::AtIterationEnd
                            (&this_01->super_ChIterativeSolverVI,this_01->r_proj_resid,auVar29._0_8_
                             ,uVar18);
                }
              }
            } while ((local_120 <= local_1c0) &&
                    (uVar18 = uVar18 + 1,
                    (int)uVar18 <
                    (this_01->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations));
          }
          (*sysd->_vptr_ChSystemDescriptor[0x13])(sysd,&local_1d8);
          (*sysd->_vptr_ChSystemDescriptor[0x11])(sysd,local_88);
          ppCVar23 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if ((sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_finish != ppCVar23) {
            uVar28 = 0;
            uVar21 = 1;
            do {
              pCVar7 = ppCVar23[uVar28];
              if (pCVar7->active == true) {
                (*pCVar7->_vptr_ChConstraint[8])(pCVar7->l_i);
              }
              ppCVar23 = (sysd->vconstraints).
                         super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              bVar8 = uVar21 < (ulong)((long)(sysd->vconstraints).
                                             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppCVar23 >> 3);
              uVar28 = uVar21;
              uVar21 = (ulong)((int)uVar21 + 1);
            } while (bVar8);
          }
          if ((this_01->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose != false)
          {
            pCVar19 = GetLog();
            ChStreamOutAscii::operator<<(&pCVar19->super_ChStreamOutAscii,"-----\n");
          }
          local_1c0 = this_01->r_proj_resid;
          if (local_88[0] != 0) {
            free(*(void **)(local_88[0] + -8));
          }
          if (local_158.m_storage.m_data != (double *)0x0) {
            free((void *)local_158.m_storage.m_data[-1]);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1b8.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_1b8.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_148.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_148.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_188.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_188.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_178.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_178.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_198.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_198.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_118.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_118.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1f8.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_1f8.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_208.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_208.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if (local_1e8.m_storage.m_data != (double *)0x0) {
            free((void *)local_1e8.m_storage.m_data[-1]);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a8.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_1a8.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if (local_1d8.m_storage.m_data != (double *)0x0) {
            free((void *)local_1d8.m_storage.m_data[-1]);
          }
          return local_1c0;
        }
      }
      else {
        if (local_1e8.m_storage.m_rows != local_208.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_1e8,local_208.m_storage.m_rows,1);
        }
        if (local_1e8.m_storage.m_rows == IVar13) {
          uVar28 = local_1e8.m_storage.m_rows + 7;
          if (-1 < local_1e8.m_storage.m_rows) {
            uVar28 = local_1e8.m_storage.m_rows;
          }
          uVar28 = uVar28 & 0xfffffffffffffff8;
          if (7 < local_1e8.m_storage.m_rows) {
            lVar27 = 0;
            do {
              *(undefined1 (*) [64])(local_1e8.m_storage.m_data + lVar27) =
                   *(undefined1 (*) [64])(pdVar2 + lVar27);
              lVar27 = lVar27 + 8;
            } while (lVar27 < (long)uVar28);
          }
          if ((long)uVar28 < local_1e8.m_storage.m_rows) {
            do {
              local_1e8.m_storage.m_data[uVar28] = pdVar2[uVar28];
              uVar28 = uVar28 + 1;
            } while (local_1e8.m_storage.m_rows != uVar28);
          }
          goto LAB_007d4783;
        }
      }
LAB_007d58b2:
      pcVar25 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
LAB_007d59c8:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar25);
    }
  }
LAB_007d59d5:
  pcVar25 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_007d5816:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar25);
}

Assistant:

double ChSolverPMINRES::Solve(ChSystemDescriptor& sysd) {
    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();

    // If stiffness blocks are used, the Schur complement cannot be esily
    // used, so fall back to the Solve_SupportingStiffness method, that operates on KKT.
    if (sysd.GetKblocksList().size() > 0)
        return this->Solve_SupportingStiffness(sysd);

    // Allocate auxiliary vectors;

    int nc = sysd.CountActiveConstraints();
    if (verbose)
        GetLog() << "\n-----Projected MINRES, solving nc=" << nc << "unknowns \n";

    ChVectorDynamic<> ml(nc);
    ChVectorDynamic<> mb(nc);
    ChVectorDynamic<> mp(nc);
    ChVectorDynamic<> mr(nc);
    ChVectorDynamic<> mz(nc);
    ChVectorDynamic<> mz_old(nc);
    ChVectorDynamic<> mNp(nc);
    ChVectorDynamic<> mMNp(nc);
    ChVectorDynamic<> mNMr(nc);
    ChVectorDynamic<> mNMr_old(nc);
    ChVectorDynamic<> mtmp(nc);
    ChVectorDynamic<> mDi(nc);

    m_iterations = 0;

    // Update auxiliary data in all constraints before starting,
    // that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        mconstraints[ic]->Update_auxiliary();

    // Average all g_i for the triplet of contact constraints n,u,v.
    //  Can be used as diagonal preconditioner.
    int j_friction_comp = 0;
    double gi_values[3];
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
            gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
            j_friction_comp++;
            if (j_friction_comp == 3) {
                double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                mconstraints[ic - 2]->Set_g_i(average_g_i);
                mconstraints[ic - 1]->Set_g_i(average_g_i);
                mconstraints[ic - 0]->Set_g_i(average_g_i);
                j_friction_comp = 0;
            }
        }
    }

    // The vector with the inverse of diagonal of the N matrix
    mDi.setZero();
    int d_i = 0;
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        if (mconstraints[ic]->IsActive()) {
            mDi(d_i, 0) = 1.0 / mconstraints[ic]->Get_g_i();
            ++d_i;
        }

    // ***TO DO*** move the following thirty lines in a short function ChSystemDescriptor::ShurBvectorCompute() ?

    // Compute the b_shur vector in the Shur complement equation N*l = b_shur
    // with
    //   N_shur  = D'* (M^-1) * D
    //   b_shur  = - c + D'*(M^-1)*k = b_i + D'*(M^-1)*k
    // but flipping the sign of lambdas,  b_shur = - b_i - D'*(M^-1)*k
    // Do this in three steps:

    // Put (M^-1)*k    in  q  sparse vector of each variable..
    for (unsigned int iv = 0; iv < mvariables.size(); iv++)
        if (mvariables[iv]->IsActive())
            mvariables[iv]->Compute_invMb_v(mvariables[iv]->Get_qb(), mvariables[iv]->Get_fb());  // q = [M]'*fb

    // ...and now do  b_shur = - D' * q  ..
    mb.setZero();
    int s_i = 0;
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        if (mconstraints[ic]->IsActive()) {
            mb(s_i, 0) = -mconstraints[ic]->Compute_Cq_q();
            ++s_i;
        }

    // ..and finally do   b_shur = b_shur - c
    sysd.BuildBiVector(mtmp);  // b_i   =   -c   = phi/h
    mb -= mtmp;

    // Optimization: backup the  q  sparse data computed above,
    // because   (M^-1)*k   will be needed at the end when computing primals.
    ChVectorDynamic<> mq;
    sysd.FromVariablesToVector(mq, true);

    double rel_tol = this->rel_tolerance;
    double abs_tol = m_tolerance;
    double rel_tol_b = mb.lpNorm<Eigen::Infinity>() * rel_tol;

    // Initialize lambdas
    if (m_warm_start)
        sysd.FromConstraintsToVector(ml);
    else
        ml.setZero();

    // Initial projection of ml   ***TO DO***?
    // ...

    // r = b - N*l;
    sysd.ShurComplementProduct(mr, ml);  // r = N*l
    mr = mb - mr;                        // r =-N*l+b

    // r = (project_orthogonal(l+diff*r, fric) - l)/diff;
    mr = ml + grad_diffstep * mr;    // r = l + diff*r
    sysd.ConstraintsProject(mr);     // r = P(l + diff*r) ...
    mr = (mr - ml) / grad_diffstep;  // r = (P(l + diff*r) - l)/diff

    // p = Mi * r;
    if (m_use_precond)
        mp = mr.array() * mDi.array();
    else
        mp = mr;

    // z = Mi * r;
    mz = mp;

    // NMr = N*M*r = N*z
    sysd.ShurComplementProduct(mNMr, mz);  // NMr = N*z

    // Np = N*p
    sysd.ShurComplementProduct(mNp, mp);  // Np = N*p

    //// RADU
    //// Is the above correct?  We always have z=p and therefore NMr = Np...

    //
    // THE LOOP
    //

    std::vector<double> f_hist;

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // MNp = Mi*Np; % = Mi*N*p                  %% -- Precond
        if (m_use_precond)
            mMNp = mNp.array() * mDi.array();
        else
            mMNp = mNp;

        // alpha = (z'*(NMr))/((MNp)'*(Np));
        double zNMr = mz.dot(mNMr);    // zMNr = z'* NMr
        double MNpNp = mMNp.dot(mNp);  //  MNpNp = ((MNp)'*(Np))

        if (fabs(MNpNp) < 10e-30) {
            if (verbose)
                GetLog() << "Iter=" << iter << " Rayleigh quotient alpha breakdown: " << zNMr << " / " << MNpNp << "\n";
            MNpNp = 10e-12;
        }

        double alpha = zNMr / MNpNp;  // alpha = (z'*(NMr))/((MNp)'*(Np));

        // l = l + alpha * p;
        mtmp = alpha * mp;
        ml += mtmp;

        double maxdeltalambda = mtmp.norm();  //***better infinity norm for speed reasons?

        // l = Proj(l)
        sysd.ConstraintsProject(ml);  // l = P(l)

        // r = b - N*l;
        sysd.ShurComplementProduct(mr, ml);  // r = N*l
        mr = mb - mr;                        // r =-N*l+b

        // r = (project_orthogonal(l+diff*r, fric) - l)/diff;
        mr = ml + grad_diffstep * mr;
        sysd.ConstraintsProject(mr);     // r = P(l+diff*r)
        mr = (mr - ml) / grad_diffstep;  // r = (P(l+diff*r)-l)/diff

        m_iterations++;

        // Terminate iteration when the projected r is small, if (norm(r,2) <= max(rel_tol_b,abs_tol))
        r_proj_resid = mr.norm();
        if (r_proj_resid < ChMax(rel_tol_b, abs_tol)) {
            if (verbose)
                GetLog() << "Iter=" << iter << " P(r)-converged!  |P(r)|=" << r_proj_resid << "\n";
            break;
        }

        // z_old = z;
        mz_old = mz;

        // z = Mi*r;                                 %% -- Precond
        if (m_use_precond)
            mz = mr.array() * mDi.array();
        else
            mz = mr;

        // NMr_old = NMr;
        mNMr_old = mNMr;

        // NMr = N*z;
        sysd.ShurComplementProduct(mNMr, mz);  // NMr = N*z

        // beta = z'*(NMr-NMr_old)/(z_old'*(NMr_old));
        mtmp = mNMr - mNMr_old;
        double numerator = mz.dot(mtmp);
        double denominator = mz_old.dot(mNMr_old);
        double beta = numerator / denominator;

        // Robustness improver: restart if beta=0 or too large
        if (fabs(denominator) < 10e-30 || fabs(numerator) < 10e-30) {
            if (verbose)
                GetLog() << "Iter=" << iter << " Ribiere quotient beta restart: " << numerator << " / " << denominator
                         << "\n";
            beta = 0;
        }

        // beta = ChMax(0.0, beta); //***NOT NEEDED!!! (may be negative in not positive def.matrices!)

        // p = z + beta * p;
        mp = mz + beta * mp;

        // Np = NMr + beta*Np;   // Optimization!! avoid matr x vect!!! (if no 'p' projection has been done)
        mNp = mNMr + beta * mNp;

        // ---------------------------------------------
        // METRICS - convergence, plots, etc

        // For recording into correction/residuals/violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(r_proj_resid, maxdeltalambda, iter);
    }

    // Resulting DUAL variables:
    // store ml temporary vector into ChConstraint 'l_i' multipliers
    sysd.FromVectorToConstraints(ml);

    // Resulting PRIMAL variables:
    // compute the primal variables as   v = (M^-1)(k + D*l)

    // v = (M^-1)*k  ...    (by rewinding to the backup vector computed ad the beginning)
    sysd.FromVectorToVariables(mq);

    // ... + (M^-1)*D*l     (this increment and also stores 'qb' in the ChVariable items)
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->IsActive())
            mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    }

    if (verbose)
        GetLog() << "-----\n";

    return r_proj_resid;
}